

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

size_t encodeCobs(void *buffer,void *p,size_t size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uint8_t *src;
  uint8_t *dst;
  size_t sVar4;
  char cVar5;
  char *pcVar6;
  
  pcVar2 = (char *)((long)buffer + 1);
  cVar5 = '\x01';
  sVar4 = 0;
  pcVar6 = (char *)buffer;
  do {
    if (size == sVar4) {
      *pcVar6 = cVar5;
      return (long)pcVar2 - (long)buffer;
    }
    cVar1 = *(char *)((long)p + sVar4);
    pcVar3 = pcVar2;
    if (cVar1 == '\0') {
LAB_00114aa2:
      *pcVar6 = cVar5;
      pcVar2 = pcVar3 + (size - 1 != sVar4 || cVar1 == '\0');
      cVar5 = '\x01';
    }
    else {
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + 1;
      cVar5 = cVar5 + '\x01';
      pcVar3 = pcVar6;
      if (cVar5 == -1) {
        cVar5 = -1;
        pcVar3 = pcVar2;
        goto LAB_00114aa2;
      }
    }
    sVar4 = sVar4 + 1;
    pcVar6 = pcVar3;
  } while( true );
}

Assistant:

size_t encodeCobs(
	void* buffer, // must be big enough
	void const* p,
	size_t size
) {
	uint8_t const* src = (uint8_t*)p;
	uint8_t* dst = (uint8_t*)buffer; // encoded byte pointer
	uint8_t* codep = dst++; // output code pointer
	uint8_t code = 1; // code value

	for (; size--; src++) {
		uint8_t c = *src;
		if (c) { // byte not zero, write it
			*dst++ = c;
			++code;
		}

		if (!c || code == 0xff) { // input is zero or block completed, restart
			*codep = code;
			code = 1;
			codep = dst;
			if (!c || size)
				++dst;
		}
	}

	*codep = code; // write final code value
	return dst - (uint8_t*)buffer;
}